

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printc.cc
# Opt level: O0

void __thiscall PrintC::emitBlockInfLoop(PrintC *this,BlockInfLoop *bl)

{
  EmitXml *pEVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  FlowBlock *pFVar5;
  undefined4 extraout_var;
  int4 id2;
  int4 id1;
  int4 id;
  PcodeOp *op;
  BlockInfLoop *bl_local;
  PrintC *this_local;
  
  PrintLanguage::pushMod(&this->super_PrintLanguage);
  PrintLanguage::unsetMod(&this->super_PrintLanguage,0x180);
  emitAnyLabelStatement(this,(FlowBlock *)bl);
  (*((this->super_PrintLanguage).emit)->_vptr_EmitXml[8])();
  pEVar1 = (this->super_PrintLanguage).emit;
  (*pEVar1->_vptr_EmitXml[0x19])(pEVar1,"do",0);
  pEVar1 = (this->super_PrintLanguage).emit;
  (*pEVar1->_vptr_EmitXml[0x21])(pEVar1,1,0);
  uVar2 = (*((this->super_PrintLanguage).emit)->_vptr_EmitXml[0x22])();
  pEVar1 = (this->super_PrintLanguage).emit;
  (*pEVar1->_vptr_EmitXml[0x19])(pEVar1,"{",8);
  pEVar1 = (this->super_PrintLanguage).emit;
  BlockGraph::getBlock(&bl->super_BlockGraph,0);
  uVar3 = (*pEVar1->_vptr_EmitXml[6])();
  pFVar5 = BlockGraph::getBlock(&bl->super_BlockGraph,0);
  (*pFVar5->_vptr_FlowBlock[0xc])(pFVar5,this);
  pEVar1 = (this->super_PrintLanguage).emit;
  (*pEVar1->_vptr_EmitXml[7])(pEVar1,(ulong)uVar3);
  pEVar1 = (this->super_PrintLanguage).emit;
  (*pEVar1->_vptr_EmitXml[0x23])(pEVar1,(ulong)uVar2);
  (*((this->super_PrintLanguage).emit)->_vptr_EmitXml[8])();
  pEVar1 = (this->super_PrintLanguage).emit;
  (*pEVar1->_vptr_EmitXml[0x19])(pEVar1,"}",8);
  pEVar1 = (this->super_PrintLanguage).emit;
  (*pEVar1->_vptr_EmitXml[0x21])(pEVar1,1,0);
  pFVar5 = BlockGraph::getBlock(&bl->super_BlockGraph,0);
  iVar4 = (*pFVar5->_vptr_FlowBlock[0xe])();
  pEVar1 = (this->super_PrintLanguage).emit;
  (*pEVar1->_vptr_EmitXml[0x13])(pEVar1,"while",0,CONCAT44(extraout_var,iVar4));
  pEVar1 = (this->super_PrintLanguage).emit;
  uVar2 = (*pEVar1->_vptr_EmitXml[0x1a])(pEVar1,0x28,0);
  pEVar1 = (this->super_PrintLanguage).emit;
  (*pEVar1->_vptr_EmitXml[0x21])(pEVar1,1,0);
  pEVar1 = (this->super_PrintLanguage).emit;
  (*pEVar1->_vptr_EmitXml[0x19])(pEVar1,"true",5);
  pEVar1 = (this->super_PrintLanguage).emit;
  (*pEVar1->_vptr_EmitXml[0x21])(pEVar1,1,0);
  pEVar1 = (this->super_PrintLanguage).emit;
  (*pEVar1->_vptr_EmitXml[0x1b])(pEVar1,0x29,(ulong)uVar2);
  pEVar1 = (this->super_PrintLanguage).emit;
  (*pEVar1->_vptr_EmitXml[0x19])(pEVar1,";",8);
  PrintLanguage::popMod(&this->super_PrintLanguage);
  return;
}

Assistant:

void PrintC::emitBlockInfLoop(const BlockInfLoop *bl)

{
  const PcodeOp *op;

  pushMod();
  unsetMod(no_branch|only_branch);
  emitAnyLabelStatement(bl);
  emit->tagLine();
  emit->print("do",EmitXml::keyword_color);
  emit->spaces(1);
  int4 id = emit->startIndent();
  emit->print("{");
  int4 id1 = emit->beginBlock(bl->getBlock(0));
  bl->getBlock(0)->emit(this);
  emit->endBlock(id1);
  emit->stopIndent(id);
  emit->tagLine();
  emit->print("}");
  emit->spaces(1);
  op = bl->getBlock(0)->lastOp();
  emit->tagOp("while",EmitXml::keyword_color,op);
  int4 id2 = emit->openParen('(');
  emit->spaces(1);
  emit->print("true",EmitXml::const_color);
  emit->spaces(1);
  emit->closeParen(')',id2);
  emit->print(";");
  popMod();
}